

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

void printf_token(Token token)

{
  Literal *pLVar1;
  char *pcVar2;
  Token token_local;
  
  pLVar1 = token.literal;
  switch(token.token_type) {
  case NULL_TOKEN:
    printf(" null ");
    break;
  case IDENTIFIER_TOKEN:
    printf(" %s ",*(undefined8 *)(pLVar1 + 2));
    break;
  case INTEGER_TOKEN:
    printf(" %lld ",*(undefined8 *)(pLVar1 + 2));
    break;
  case FLOAT_TOKEN:
    printf(" %Lf ");
    break;
  case BOOL_TOKEN:
    pcVar2 = "false";
    if ((pLVar1[1].literal_type & LiteralTypeIntegerLiteral) != LiteralTypeBoolLiteral) {
      pcVar2 = "true";
    }
    printf(" %s ",pcVar2);
    break;
  case STRING_LITERAL_TOKEN:
    printf(" \"%s\" ",*(undefined8 *)(pLVar1 + 2));
  }
  return;
}

Assistant:

void printf_token(Token token) {
  switch (token.token_type) {
    case NULL_TOKEN: {
      printf(" null ");

      break;
    }

    case IDENTIFIER_TOKEN: {
      printf(" %s ", ((StringLiteral *)token.literal)->string_literal);

      break;
    }

    case INTEGER_TOKEN: {
      printf(" %lld ", ((IntegerLiteral *)token.literal)->integer_literal);

      break;
    }

    case FLOAT_TOKEN: {
      printf(" %Lf ", ((FloatLiteral *)token.literal)->float_literal);

      break;
    }

    case BOOL_TOKEN: {
      printf(" %s ", ((BoolLiteral *)token.literal)->bool_literal ? "true" : "false");

      break;
    }

    case STRING_LITERAL_TOKEN: {
      printf(" \"%s\" ", ((StringLiteral *)token.literal)->string_literal);

      break;
    }
  }
}